

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O0

iterator * __thiscall
skiplist<DictKey,_std::less<DictKey>_>::find
          (iterator *__return_storage_ptr__,skiplist<DictKey,_std::less<DictKey>_> *this,
          DictKey *value)

{
  bool bVar1;
  reference ppSVar2;
  bool local_4a;
  bool local_49;
  value_type local_20;
  SLNode<DictKey> *follow;
  DictKey *value_local;
  skiplist<DictKey,_std::less<DictKey>_> *this_local;
  
  bVar1 = std::vector<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>::empty(&this->key);
  if (bVar1) {
    end(__return_storage_ptr__,this);
  }
  else {
    ppSVar2 = std::vector<SLNode<DictKey>_*,_std::allocator<SLNode<DictKey>_*>_>::back(&this->key);
    for (local_20 = *ppSVar2; local_20->down != (SLNode<DictKey> *)0x0; local_20 = local_20->down) {
      while( true ) {
        local_49 = false;
        if (local_20->next != (SLNode<DictKey> *)0x0) {
          local_49 = std::less<DictKey>::operator()
                               ((less<DictKey> *)&this->field_0xa00,&local_20->next->val,value);
        }
        if (local_49 == false) break;
        local_20 = local_20->next;
      }
    }
    while( true ) {
      local_4a = false;
      if (local_20->next != (SLNode<DictKey> *)0x0) {
        local_4a = std::less<DictKey>::operator()
                             ((less<DictKey> *)&this->field_0xa00,&local_20->next->val,value);
      }
      if (local_4a == false) break;
      local_20 = local_20->next;
    }
    if ((local_20->next == (SLNode<DictKey> *)0x0) ||
       (bVar1 = _420_is_equal<DictKey,std::less<DictKey>>(&local_20->next->val,value), !bVar1)) {
      end(__return_storage_ptr__,this);
    }
    else {
      cake_iterator<false>::cake_iterator(__return_storage_ptr__,local_20->next);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

typename skiplist<T, X>::iterator skiplist<T, X>::find(T value) {
    // Same algorithm as erase, but without erasing anything ;)
    if(key.empty())
        return end();

    // Start from top left
    SLNode<T>* follow = key.back();
    // Go on till level 0
    while(follow->down) {
        while(follow->next && compare(follow->next->val, value))
            follow = follow->next;
        follow = follow->down;
    }
    // Traverse at level 0 till dest reached
    while(follow->next && compare(follow->next->val, value))
        follow = follow->next;

    // If not exist, leave
    if(!follow->next || !_420_is_equal(follow->next->val, value, compare))
        return end();

    // This is the node for sure
    follow = follow->next;
    return iterator(follow);
}